

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncat.c
# Opt level: O1

char * strncat(char *__dest,char *__src,size_t __n)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *rc;
  long lVar4;
  bool bVar5;
  
  pcVar1 = __dest;
  do {
    pcVar3 = pcVar1;
    pcVar1 = pcVar3 + 1;
  } while (*pcVar3 != '\0');
  bVar5 = __n == 0;
  if ((!bVar5) && (cVar2 = *__src, *pcVar3 = cVar2, pcVar3 = pcVar1, cVar2 != '\0')) {
    lVar4 = 0;
    do {
      bVar5 = __n - 1 == lVar4;
      if (bVar5) break;
      cVar2 = __src[lVar4 + 1];
      pcVar1[lVar4] = cVar2;
      lVar4 = lVar4 + 1;
    } while (cVar2 != '\0');
    pcVar3 = pcVar1 + lVar4;
  }
  if (bVar5) {
    *pcVar3 = '\0';
  }
  return __dest;
}

Assistant:

char * strncat( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2, size_t n )
{
    char * rc = s1;

    while ( *s1 )
    {
        ++s1;
    }

    while ( n && ( *s1++ = *s2++ ) )
    {
        --n;
    }

    if ( n == 0 )
    {
        *s1 = '\0';
    }

    return rc;
}